

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_life_tokens.hpp
# Opt level: O0

void __thiscall
wigwag::life_assurance::intrusive_life_tokens::life_assurance::release_life_assurance
          (life_assurance *this,shared_data *sd)

{
  __int_type_conflict _Var1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> l;
  shared_data *sd_local;
  life_assurance *this_local;
  
  l._8_8_ = sd;
  std::__atomic_base<unsigned_int>::operator-=
            (&(this->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>,0x80000000);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,(mutex_type *)(l._8_8_ + 0x30));
  while( true ) {
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base *)&this->_lock_counter_and_alive_flag);
    if (_Var1 == 0) break;
    std::condition_variable::wait((unique_lock *)l._8_8_);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void release_life_assurance(const shared_data& sd)
            {
                _lock_counter_and_alive_flag -= alive_flag;
                std::unique_lock<std::mutex> l(sd._mutex);
                while (_lock_counter_and_alive_flag != 0)
                    sd._cond_var.wait(l);
            }